

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
* duckdb::
  DefaultMapType<std::unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>_>
  ::CreateEmpty(ArenaAllocator *param_1)

{
  unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
  *puVar1;
  
  puVar1 = (unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
            *)operator_new(0x38);
  *(undefined8 *)&(puVar1->_M_h)._M_rehash_policy = 0;
  (puVar1->_M_h)._M_rehash_policy._M_next_resize = 0;
  (puVar1->_M_h)._M_buckets = &(puVar1->_M_h)._M_single_bucket;
  (puVar1->_M_h)._M_bucket_count = 1;
  (puVar1->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (puVar1->_M_h)._M_element_count = 0;
  (puVar1->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (puVar1->_M_h)._M_rehash_policy._M_next_resize = 0;
  (puVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  return puVar1;
}

Assistant:

static TYPE *CreateEmpty(ArenaAllocator &) {
		return new TYPE();
	}